

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

void absl::lts_20250127::cord_internal::CordRepBtree::Destroy(CordRepBtree *tree)

{
  RefcountAndFlags *pRVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  CordRep *pCVar6;
  CordRep *rep;
  CordRepBtree *tree_00;
  CordRep **ppCVar7;
  long lVar8;
  iterator __end3;
  ulong uVar9;
  
  uVar2 = (tree->super_CordRep).storage[0];
  bVar3 = (tree->super_CordRep).storage[1];
  bVar4 = (tree->super_CordRep).storage[2];
  if (uVar2 == '\x01') {
    if (bVar3 != bVar4) {
      ppCVar7 = tree->edges_ + bVar3;
      do {
        pCVar6 = *ppCVar7;
        uVar5 = (pCVar6->refcount).count_.super___atomic_base<int>._M_i;
        if ((uVar5 & 1) == 0 && (int)uVar5 < 1) goto LAB_0024fda4;
        if (uVar5 == 2) {
LAB_0024fc34:
          if (pCVar6->tag != '\x03') goto LAB_0024fdc3;
          bVar3 = pCVar6->storage[2];
          if (pCVar6->storage[1] != bVar3) {
            lVar8 = (ulong)pCVar6->storage[1] << 3;
            do {
              rep = *(CordRep **)(pCVar6[1].storage + lVar8 + -0xd);
              uVar5 = (rep->refcount).count_.super___atomic_base<int>._M_i;
              if ((uVar5 & 1) == 0 && (int)uVar5 < 1) goto LAB_0024fda4;
              if (uVar5 == 2) {
LAB_0024fc7e:
                anon_unknown_0::DeleteLeafEdge(rep);
              }
              else {
                pRVar1 = &rep->refcount;
                LOCK();
                (pRVar1->count_).super___atomic_base<int>._M_i =
                     (pRVar1->count_).super___atomic_base<int>._M_i + -2;
                UNLOCK();
                if ((pRVar1->count_).super___atomic_base<int>._M_i == 0) goto LAB_0024fc7e;
              }
              lVar8 = lVar8 + 8;
            } while ((ulong)bVar3 * 8 != lVar8);
          }
          if (pCVar6->tag != '\x03') goto LAB_0024fdc3;
          if (pCVar6 != (CordRep *)0x0) {
            operator_delete(pCVar6,0x40);
          }
        }
        else {
          pRVar1 = &pCVar6->refcount;
          LOCK();
          (pRVar1->count_).super___atomic_base<int>._M_i =
               (pRVar1->count_).super___atomic_base<int>._M_i + -2;
          UNLOCK();
          if ((pRVar1->count_).super___atomic_base<int>._M_i == 0) goto LAB_0024fc34;
        }
        ppCVar7 = ppCVar7 + 1;
      } while (ppCVar7 != tree->edges_ + bVar4);
    }
  }
  else if (uVar2 == '\0') {
    if (bVar3 != bVar4) {
      uVar9 = (ulong)((uint)bVar3 * 8);
      do {
        pCVar6 = *(CordRep **)((long)tree->edges_ + uVar9);
        uVar5 = (pCVar6->refcount).count_.super___atomic_base<int>._M_i;
        if ((uVar5 & 1) == 0 && (int)uVar5 < 1) {
LAB_0024fda4:
          __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0xa2,"bool absl::cord_internal::RefcountAndFlags::Decrement()");
        }
        if (uVar5 == 2) {
LAB_0024fbeb:
          anon_unknown_0::DeleteLeafEdge(pCVar6);
        }
        else {
          pRVar1 = &pCVar6->refcount;
          LOCK();
          (pRVar1->count_).super___atomic_base<int>._M_i =
               (pRVar1->count_).super___atomic_base<int>._M_i + -2;
          UNLOCK();
          if ((pRVar1->count_).super___atomic_base<int>._M_i == 0) goto LAB_0024fbeb;
        }
        uVar9 = uVar9 + 8;
      } while ((ulong)bVar4 * 8 != uVar9);
    }
  }
  else if (bVar3 != bVar4) {
    ppCVar7 = tree->edges_ + bVar3;
    do {
      pCVar6 = *ppCVar7;
      uVar5 = (pCVar6->refcount).count_.super___atomic_base<int>._M_i;
      if ((uVar5 & 1) == 0 && (int)uVar5 < 1) goto LAB_0024fda4;
      if (uVar5 == 2) {
LAB_0024fcf1:
        if (pCVar6->tag != '\x03') {
LAB_0024fdc3:
          __assert_fail("IsBtree()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                        ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
        }
        bVar3 = pCVar6->storage[2];
        if (pCVar6->storage[1] != bVar3) {
          lVar8 = (ulong)pCVar6->storage[1] << 3;
          do {
            tree_00 = *(CordRepBtree **)(pCVar6[1].storage + lVar8 + -0xd);
            uVar5 = (tree_00->super_CordRep).refcount.count_.super___atomic_base<int>._M_i;
            if ((uVar5 & 1) == 0 && (int)uVar5 < 1) goto LAB_0024fda4;
            if (uVar5 == 2) {
LAB_0024fd37:
              if ((tree_00->super_CordRep).tag != '\x03') goto LAB_0024fdc3;
              Destroy(tree_00);
            }
            else {
              pRVar1 = &(tree_00->super_CordRep).refcount;
              LOCK();
              (pRVar1->count_).super___atomic_base<int>._M_i =
                   (pRVar1->count_).super___atomic_base<int>._M_i + -2;
              UNLOCK();
              if ((pRVar1->count_).super___atomic_base<int>._M_i == 0) goto LAB_0024fd37;
            }
            lVar8 = lVar8 + 8;
          } while ((ulong)bVar3 * 8 != lVar8);
        }
        if (pCVar6->tag != '\x03') goto LAB_0024fdc3;
        if (pCVar6 != (CordRep *)0x0) {
          operator_delete(pCVar6,0x40);
        }
      }
      else {
        pRVar1 = &pCVar6->refcount;
        LOCK();
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + -2;
        UNLOCK();
        if ((pRVar1->count_).super___atomic_base<int>._M_i == 0) goto LAB_0024fcf1;
      }
      ppCVar7 = ppCVar7 + 1;
    } while (ppCVar7 != tree->edges_ + bVar4);
  }
  if (tree == (CordRepBtree *)0x0) {
    return;
  }
  operator_delete(tree,0x40);
  return;
}

Assistant:

void CordRepBtree::Destroy(CordRepBtree* tree) {
  switch (tree->height()) {
    case 0:
      for (CordRep* edge : tree->Edges()) {
        if (!edge->refcount.Decrement()) {
          DeleteLeafEdge(edge);
        }
      }
      return CordRepBtree::Delete(tree);
    case 1:
      return DestroyTree<1>(tree);
    default:
      return DestroyTree<2>(tree);
  }
}